

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeAsyncGeneratorFunctionPrototype
               (DynamicObject *asyncGeneratorFunctionPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  StaticType *type;
  LiteralString *pLVar6;
  uint uVar8;
  ulong uVar7;
  
  uVar8 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,asyncGeneratorFunctionPrototype,mode,3,0);
  pJVar1 = (((asyncGeneratorFunctionPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary)
           .ptr;
  pSVar2 = (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar2->config).threadConfig)->m_ES2018AsyncIteration == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0xb78,
                                "(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled())"
                                ,
                                "library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled()"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  uVar7 = (ulong)uVar8 << 0x20;
  (*(asyncGeneratorFunctionPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (asyncGeneratorFunctionPrototype,0x67,
             (pJVar1->super_JavascriptLibraryBase).asyncGeneratorFunctionConstructor.ptr,2,0,0,uVar7
            );
  uVar7 = uVar7 & 0xffffffff00000000;
  (*(asyncGeneratorFunctionPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (asyncGeneratorFunctionPrototype,0x124,
             (pJVar1->super_JavascriptLibraryBase).asyncGeneratorPrototype.ptr,2,0,0,uVar7);
  if (((pSVar2->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
    pLVar6 = LiteralString::New(type,L"AsyncGeneratorFunction",0x16,pJVar1->recycler);
    (*(asyncGeneratorFunctionPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (asyncGeneratorFunctionPrototype,0x1b,pLVar6,2,0,0,uVar7 & 0xffffffff00000000);
  }
  DynamicObject::SetHasNoEnumerableProperties(asyncGeneratorFunctionPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeAsyncGeneratorFunctionPrototype(DynamicObject* asyncGeneratorFunctionPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(asyncGeneratorFunctionPrototype, mode, 3);
        JavascriptLibrary* library = asyncGeneratorFunctionPrototype->GetLibrary();
        ScriptContext* scriptContext = library->GetScriptContext();
        Assert(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled());

        library->AddMember(asyncGeneratorFunctionPrototype, PropertyIds::constructor, library->asyncGeneratorFunctionConstructor, PropertyConfigurable);
        library->AddMember(asyncGeneratorFunctionPrototype, PropertyIds::prototype, library->asyncGeneratorPrototype, PropertyConfigurable);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(asyncGeneratorFunctionPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("AsyncGeneratorFunction")), PropertyConfigurable);
        }
        asyncGeneratorFunctionPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }